

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pi.c
# Opt level: O3

void opj_get_all_encoding_parameters
               (opj_image_t *p_image,opj_cp_t *p_cp,OPJ_UINT32 tileno,OPJ_UINT32 *p_tx0,
               OPJ_UINT32 *p_tx1,OPJ_UINT32 *p_ty0,OPJ_UINT32 *p_ty1,OPJ_UINT32 *p_dx_min,
               OPJ_UINT32 *p_dy_min,OPJ_UINT32 *p_max_prec,OPJ_UINT32 *p_max_res,
               OPJ_UINT32 **p_resolutions)

{
  uint uVar1;
  OPJ_UINT32 OVar2;
  OPJ_UINT32 OVar3;
  uint uVar4;
  byte bVar5;
  byte bVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  uint uVar17;
  opj_image_comp_t *poVar18;
  OPJ_UINT32 *pOVar19;
  opj_tccp_t *poVar20;
  ulong uVar21;
  
  uVar9 = p_cp->tw;
  if (p_cp->th * uVar9 <= tileno) {
    __assert_fail("tileno < p_cp->tw * p_cp->th",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cinecert[P]openjpeg/src/lib/openjp2/pi.c"
                  ,0x394,
                  "void opj_get_all_encoding_parameters(const opj_image_t *, const opj_cp_t *, OPJ_UINT32, OPJ_UINT32 *, OPJ_UINT32 *, OPJ_UINT32 *, OPJ_UINT32 *, OPJ_UINT32 *, OPJ_UINT32 *, OPJ_UINT32 *, OPJ_UINT32 *, OPJ_UINT32 **)"
                 );
  }
  poVar20 = p_cp->tcps[tileno].tccps;
  poVar18 = p_image->comps;
  uVar7 = (tileno % uVar9) * p_cp->tdx + p_cp->tx0;
  uVar8 = p_image->x0;
  if (p_image->x0 < uVar7) {
    uVar8 = uVar7;
  }
  *p_tx0 = uVar8;
  uVar8 = uVar7 + p_cp->tdx;
  if (CARRY4(uVar7,p_cp->tdx)) {
    uVar8 = 0xffffffff;
  }
  if (p_image->x1 <= uVar8) {
    uVar8 = p_image->x1;
  }
  *p_tx1 = uVar8;
  uVar8 = (tileno / uVar9) * p_cp->tdy + p_cp->ty0;
  uVar9 = p_image->y0;
  if (p_image->y0 < uVar8) {
    uVar9 = uVar8;
  }
  *p_ty0 = uVar9;
  uVar9 = uVar8 + p_cp->tdy;
  if (CARRY4(uVar8,p_cp->tdy)) {
    uVar9 = 0xffffffff;
  }
  if (p_image->y1 <= uVar9) {
    uVar9 = p_image->y1;
  }
  *p_ty1 = uVar9;
  *p_max_prec = 0;
  *p_max_res = 0;
  *p_dx_min = 0x7fffffff;
  *p_dy_min = 0x7fffffff;
  if (p_image->numcomps != 0) {
    uVar10 = 0;
    do {
      if (p_resolutions == (OPJ_UINT32 **)0x0) {
        pOVar19 = (OPJ_UINT32 *)0x0;
      }
      else {
        pOVar19 = p_resolutions[uVar10];
      }
      uVar16 = (ulong)poVar18->dx;
      if (uVar16 == 0) {
LAB_0012a998:
        __assert_fail("b",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/cinecert[P]openjpeg/src/lib/openjp2/opj_intmath.h"
                      ,0xac,"OPJ_UINT32 opj_uint_ceildiv(OPJ_UINT32, OPJ_UINT32)");
      }
      uVar9 = *p_tx0;
      uVar12 = (ulong)poVar18->dy;
      if (uVar12 == 0) goto LAB_0012a998;
      uVar8 = *p_ty0;
      uVar7 = *p_tx1;
      uVar1 = *p_ty1;
      uVar11 = poVar20->numresolutions;
      if (*p_max_res < uVar11) {
        *p_max_res = uVar11;
        uVar11 = poVar20->numresolutions;
      }
      if (uVar11 != 0) {
        uVar15 = 0;
        do {
          uVar11 = uVar11 - 1;
          OVar2 = poVar20->prcw[uVar15];
          OVar3 = poVar20->prch[uVar15];
          if (pOVar19 == (OPJ_UINT32 *)0x0) {
            pOVar19 = (OPJ_UINT32 *)0x0;
          }
          else {
            *pOVar19 = OVar2;
            pOVar19[1] = OVar3;
            pOVar19 = pOVar19 + 2;
          }
          if (uVar11 + OVar2 < 0x20) {
            bVar5 = (byte)(uVar11 + OVar2);
            if (poVar18->dx <= 0xffffffffU >> (bVar5 & 0x1f)) {
              uVar4 = poVar18->dx << (bVar5 & 0x1f);
              if (*p_dx_min < uVar4) {
                uVar4 = *p_dx_min;
              }
              *p_dx_min = uVar4;
            }
          }
          if (uVar11 + OVar3 < 0x20) {
            bVar5 = (byte)(uVar11 + OVar3);
            if (poVar18->dy <= 0xffffffffU >> (bVar5 & 0x1f)) {
              uVar4 = poVar18->dy << (bVar5 & 0x1f);
              if (*p_dy_min < uVar4) {
                uVar4 = *p_dy_min;
              }
              *p_dy_min = uVar4;
            }
          }
          bVar5 = (byte)uVar11;
          uVar13 = ~(-1L << (bVar5 & 0x3f));
          uVar21 = (((ulong)uVar7 + (uVar16 - 1)) / uVar16 & 0xffffffff) + uVar13 >> (bVar5 & 0x3f);
          uVar14 = uVar13 + (((uVar1 + uVar12) - 1) / uVar12 & 0xffffffff) >> (bVar5 & 0x3f);
          uVar17 = (uint)((((uVar9 + uVar16) - 1) / uVar16 & 0xffffffff) + uVar13 >> (bVar5 & 0x3f))
          ;
          bVar6 = (byte)OVar2;
          uVar4 = (uint)((((uVar8 + uVar12) - 1) / uVar12 & 0xffffffff) + uVar13 >> (bVar5 & 0x3f));
          bVar5 = (byte)OVar3;
          OVar2 = ((int)(((uVar21 & 0xffffffff) + (1L << (bVar6 & 0x3f))) - 1 >> (bVar6 & 0x3f)) -
                   (uVar17 >> (bVar6 & 0x1f)) << (bVar6 & 0x1f)) >> (bVar6 & 0x1f);
          if (uVar17 == (uint)uVar21) {
            OVar2 = 0;
          }
          OVar3 = ((int)(((1L << (bVar5 & 0x3f)) + (uVar14 & 0xffffffff)) - 1 >> (bVar5 & 0x3f)) -
                   (uVar4 >> (bVar5 & 0x1f)) << (bVar5 & 0x1f)) >> (bVar5 & 0x1f);
          if (uVar4 == (uint)uVar14) {
            OVar3 = 0;
          }
          if (pOVar19 == (OPJ_UINT32 *)0x0) {
            pOVar19 = (OPJ_UINT32 *)0x0;
          }
          else {
            *pOVar19 = OVar2;
            pOVar19[1] = OVar3;
            pOVar19 = pOVar19 + 2;
          }
          if (*p_max_prec < OVar3 * OVar2) {
            *p_max_prec = OVar3 * OVar2;
          }
          uVar15 = uVar15 + 1;
        } while (uVar15 < poVar20->numresolutions);
      }
      poVar20 = poVar20 + 1;
      poVar18 = poVar18 + 1;
      uVar10 = uVar10 + 1;
    } while (uVar10 < p_image->numcomps);
  }
  return;
}

Assistant:

static void opj_get_all_encoding_parameters(const opj_image_t *p_image,
        const opj_cp_t *p_cp,
        OPJ_UINT32 tileno,
        OPJ_UINT32 * p_tx0,
        OPJ_UINT32 * p_tx1,
        OPJ_UINT32 * p_ty0,
        OPJ_UINT32 * p_ty1,
        OPJ_UINT32 * p_dx_min,
        OPJ_UINT32 * p_dy_min,
        OPJ_UINT32 * p_max_prec,
        OPJ_UINT32 * p_max_res,
        OPJ_UINT32 ** p_resolutions)
{
    /* loop*/
    OPJ_UINT32 compno, resno;

    /* pointers*/
    const opj_tcp_t *tcp = 00;
    const opj_tccp_t * l_tccp = 00;
    const opj_image_comp_t * l_img_comp = 00;

    /* to store l_dx, l_dy, w and h for each resolution and component.*/
    OPJ_UINT32 * lResolutionPtr;

    /* position in x and y of tile*/
    OPJ_UINT32 p, q;

    /* non-corrected (in regard to image offset) tile offset */
    OPJ_UINT32 l_tx0, l_ty0;

    /* preconditions in debug*/
    assert(p_cp != 00);
    assert(p_image != 00);
    assert(tileno < p_cp->tw * p_cp->th);

    /* initializations*/
    tcp = &p_cp->tcps [tileno];
    l_tccp = tcp->tccps;
    l_img_comp = p_image->comps;

    /* position in x and y of tile*/
    p = tileno % p_cp->tw;
    q = tileno / p_cp->tw;

    /* here calculation of tx0, tx1, ty0, ty1, maxprec, l_dx and l_dy */
    l_tx0 = p_cp->tx0 + p *
            p_cp->tdx; /* can't be greater than p_image->x1 so won't overflow */
    *p_tx0 = opj_uint_max(l_tx0, p_image->x0);
    *p_tx1 = opj_uint_min(opj_uint_adds(l_tx0, p_cp->tdx), p_image->x1);
    l_ty0 = p_cp->ty0 + q *
            p_cp->tdy; /* can't be greater than p_image->y1 so won't overflow */
    *p_ty0 = opj_uint_max(l_ty0, p_image->y0);
    *p_ty1 = opj_uint_min(opj_uint_adds(l_ty0, p_cp->tdy), p_image->y1);

    /* max precision and resolution is 0 (can only grow)*/
    *p_max_prec = 0;
    *p_max_res = 0;

    /* take the largest value for dx_min and dy_min*/
    *p_dx_min = 0x7fffffff;
    *p_dy_min = 0x7fffffff;

    for (compno = 0; compno < p_image->numcomps; ++compno) {
        /* arithmetic variables to calculate*/
        OPJ_UINT32 l_level_no;
        OPJ_UINT32 l_rx0, l_ry0, l_rx1, l_ry1;
        OPJ_UINT32 l_px0, l_py0, l_px1, py1;
        OPJ_UINT32 l_product;
        OPJ_UINT32 l_tcx0, l_tcy0, l_tcx1, l_tcy1;
        OPJ_UINT32 l_pdx, l_pdy, l_pw, l_ph;

        lResolutionPtr = p_resolutions ? p_resolutions[compno] : NULL;

        l_tcx0 = opj_uint_ceildiv(*p_tx0, l_img_comp->dx);
        l_tcy0 = opj_uint_ceildiv(*p_ty0, l_img_comp->dy);
        l_tcx1 = opj_uint_ceildiv(*p_tx1, l_img_comp->dx);
        l_tcy1 = opj_uint_ceildiv(*p_ty1, l_img_comp->dy);

        if (l_tccp->numresolutions > *p_max_res) {
            *p_max_res = l_tccp->numresolutions;
        }

        /* use custom size for precincts*/
        l_level_no = l_tccp->numresolutions;
        for (resno = 0; resno < l_tccp->numresolutions; ++resno) {
            OPJ_UINT32 l_dx, l_dy;

            --l_level_no;

            /* precinct width and height*/
            l_pdx = l_tccp->prcw[resno];
            l_pdy = l_tccp->prch[resno];
            if (lResolutionPtr) {
                *lResolutionPtr++ = l_pdx;
                *lResolutionPtr++ = l_pdy;
            }
            if (l_pdx + l_level_no < 32 &&
                    l_img_comp->dx <= UINT_MAX / (1u << (l_pdx + l_level_no))) {
                l_dx = l_img_comp->dx * (1u << (l_pdx + l_level_no));
                /* take the minimum size for l_dx for each comp and resolution*/
                *p_dx_min = opj_uint_min(*p_dx_min, l_dx);
            }
            if (l_pdy + l_level_no < 32 &&
                    l_img_comp->dy <= UINT_MAX / (1u << (l_pdy + l_level_no))) {
                l_dy = l_img_comp->dy * (1u << (l_pdy + l_level_no));
                *p_dy_min = opj_uint_min(*p_dy_min, l_dy);
            }

            /* various calculations of extents*/
            l_rx0 = opj_uint_ceildivpow2(l_tcx0, l_level_no);
            l_ry0 = opj_uint_ceildivpow2(l_tcy0, l_level_no);
            l_rx1 = opj_uint_ceildivpow2(l_tcx1, l_level_no);
            l_ry1 = opj_uint_ceildivpow2(l_tcy1, l_level_no);
            l_px0 = opj_uint_floordivpow2(l_rx0, l_pdx) << l_pdx;
            l_py0 = opj_uint_floordivpow2(l_ry0, l_pdy) << l_pdy;
            l_px1 = opj_uint_ceildivpow2(l_rx1, l_pdx) << l_pdx;
            py1 = opj_uint_ceildivpow2(l_ry1, l_pdy) << l_pdy;
            l_pw = (l_rx0 == l_rx1) ? 0 : ((l_px1 - l_px0) >> l_pdx);
            l_ph = (l_ry0 == l_ry1) ? 0 : ((py1 - l_py0) >> l_pdy);
            if (lResolutionPtr) {
                *lResolutionPtr++ = l_pw;
                *lResolutionPtr++ = l_ph;
            }
            l_product = l_pw * l_ph;

            /* update precision*/
            if (l_product > *p_max_prec) {
                *p_max_prec = l_product;
            }

        }
        ++l_tccp;
        ++l_img_comp;
    }
}